

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::HungarianSolver<double,_unsigned_long,_std::less<double>_>::
subtractSmallestUncoveredElement(HungarianSolver<double,_unsigned_long,_std::less<double>_> *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_t sVar4;
  reference pdVar5;
  double *pdVar6;
  logic_error *this_00;
  byte local_139;
  bool local_129;
  reference local_100;
  reference local_f0;
  reference local_e0;
  reference local_d0;
  reference local_c0;
  reference local_b0;
  ulong local_a0;
  size_t col_1;
  size_t row_1;
  size_t i;
  allocator local_71;
  string local_70 [32];
  reference local_50;
  ulong local_40;
  size_t col;
  ulong local_28;
  size_t row;
  double h;
  HungarianSolver<double,_unsigned_long,_std::less<double>_> *pHStack_10;
  bool found_minimum;
  HungarianSolver<double,_unsigned_long,_std::less<double>_> *this_local;
  
  h._7_1_ = 0;
  row = (size_t)this->zero_cost_;
  pHStack_10 = this;
  for (local_28 = 0; local_28 < *(ulong *)this; local_28 = local_28 + 1) {
    _col = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)&this->field_0x10,local_28);
    bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&col);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      for (local_40 = 0; local_40 < *(ulong *)&this->field_0x8; local_40 = local_40 + 1) {
        local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&this->field_0x38,local_40);
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_50);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          if ((h._7_1_ & 1) == 0) {
            sVar4 = HungarianSolverBase::getIndex
                              (&this->super_HungarianSolverBase,local_28,local_40);
            pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->cost_matrix_,sVar4);
            row = (size_t)*pdVar5;
            h._7_1_ = 1;
          }
          else {
            sVar4 = HungarianSolverBase::getIndex
                              (&this->super_HungarianSolverBase,local_28,local_40);
            pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->cost_matrix_,sVar4);
            pdVar6 = std::min<double>((double *)&row,pdVar5);
            row = (size_t)*pdVar6;
          }
        }
      }
    }
  }
  if ((h._7_1_ & 1) != 0) {
    row_1 = 0;
    for (col_1 = 0; col_1 < *(ulong *)this; col_1 = col_1 + 1) {
      for (local_a0 = 0; local_a0 < *(ulong *)&this->field_0x8; local_a0 = local_a0 + 1) {
        local_b0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&this->field_0x10,col_1);
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
        local_129 = false;
        if (bVar3) {
          local_c0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&this->field_0x38,local_a0);
          local_129 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
        }
        sVar4 = row;
        if (local_129 == false) {
          local_e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&this->field_0x10,col_1);
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_e0);
          local_139 = 0;
          if (!bVar3) {
            local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&this->field_0x38,local_a0)
            ;
            bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_f0);
            local_139 = bVar3 ^ 0xff;
          }
          sVar4 = row;
          if ((local_139 & 1) != 0) {
            pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->cost_matrix_,row_1);
            *pdVar5 = *pdVar5 - (double)sVar4;
            pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->cost_matrix_,row_1);
            dVar1 = *pdVar5;
            dVar2 = this->zero_cost_;
            local_100 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)&this->field_0x60,row_1);
            std::_Bit_reference::operator=(&local_100,dVar1 == dVar2);
          }
        }
        else {
          pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->cost_matrix_,row_1);
          *pdVar5 = (double)sVar4 + *pdVar5;
          pdVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->cost_matrix_,row_1);
          dVar1 = *pdVar5;
          dVar2 = this->zero_cost_;
          local_d0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&this->field_0x60,row_1);
          std::_Bit_reference::operator=(&local_d0,dVar1 == dVar2);
        }
        row_1 = row_1 + 1;
      }
    }
    return;
  }
  i._3_1_ = 1;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"Hungarian algorithm: !found_minimum; this should never happen",&local_71);
  std::logic_error::logic_error(this_00,local_70);
  i._3_1_ = 0;
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }